

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

int get_str_attr(char **str_ptr,char *name,char *start,char *end)

{
  int iVar1;
  size_t sVar2;
  ushort **ppuVar3;
  char *pcVar4;
  char *pcVar5;
  char *in_RCX;
  long in_RDX;
  char *in_RSI;
  undefined8 *in_RDI;
  bool bVar6;
  char *next_space;
  char *end_quote;
  char *attr;
  char *point;
  int name_len;
  char *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  char *local_38;
  char *local_20;
  
  sVar2 = strlen(in_RSI);
  local_20 = (char *)(in_RDX + -1);
  while( true ) {
    do {
      do {
        do {
          local_20 = local_20 + 1;
          if (in_RCX + -(long)(int)sVar2 <= local_20) {
            return 0;
          }
        } while ((*local_20 != *in_RSI) ||
                (iVar1 = is_tag(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0), iVar1 == 0));
        local_38 = local_20 + (int)sVar2;
        while (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)*local_38] & 0x2000) != 0) {
          local_38 = local_38 + 1;
        }
      } while ((in_RCX < local_38) || (*local_38 != '='));
      do {
        pcVar4 = local_38;
        local_38 = pcVar4 + 1;
        ppuVar3 = __ctype_b_loc();
      } while (((*ppuVar3)[(int)*local_38] & 0x2000) != 0);
    } while (in_RCX < local_38);
    pcVar5 = local_38;
    if (*local_38 != '\"') break;
    in_stack_ffffffffffffffb8 = strchr(pcVar4 + 2,0x22);
    pcVar4 = pcVar4 + 2;
    if ((in_stack_ffffffffffffffb8 != (char *)0x0) && (in_stack_ffffffffffffffb8 <= in_RCX)) {
      pcVar5 = (char *)ffs_malloc((size_t)in_stack_ffffffffffffffb0);
      strncpy(pcVar5,pcVar4,(long)in_stack_ffffffffffffffb8 - (long)pcVar4);
      pcVar5[(long)in_stack_ffffffffffffffb8 - (long)pcVar4] = '\0';
      *in_RDI = pcVar5;
      return 1;
    }
  }
  while( true ) {
    ppuVar3 = __ctype_b_loc();
    bVar6 = true;
    if (((*ppuVar3)[(int)*pcVar5] & 8) == 0) {
      bVar6 = *pcVar5 == '_';
    }
    if (!bVar6) break;
    pcVar5 = pcVar5 + 1;
  }
  pcVar4 = (char *)ffs_malloc((size_t)pcVar5);
  strncpy(pcVar4,local_38,(long)pcVar5 - (long)local_38);
  pcVar4[(long)pcVar5 - (long)local_38] = '\0';
  *in_RDI = pcVar4;
  return 1;
}

Assistant:

static int
get_str_attr(char **str_ptr, char *name, char *start, char *end)
{
    int name_len = (int)strlen(name);
    start -= 1;
    while(++start < (end - name_len)) {
	if (*start == *name) {
	    /* first char eq, check further */
	    if (is_tag(name, start)) {
		char *point = &start[name_len];
		char *attr = NULL;
		while (isspace((int)*point)) point++;
		if (point > end) continue;
		if (*point != '=') continue;
		point++;
		while (isspace((int)*point)) point++;
		if (point > end) continue;
		if (*point == '"') {
		    /* begin quote */
		    char *end_quote = strchr(point+1, '"');
		    point++;
		    if ((end_quote == 0) || (end_quote > end)) continue;
		    attr = malloc(end_quote - point + 1);
		    strncpy(attr, point, end_quote - point);
		    attr[end_quote - point] = 0;
		    *str_ptr = attr;
		    return 1;
		} else {
		    char *next_space = point;
		    while(isalnum((int)*next_space) || (*next_space=='_')) 
			next_space++;
		    attr = malloc(next_space - point+1);
		    strncpy(attr, point, next_space - point);
		    attr[next_space - point] = 0;
		    *str_ptr = attr;
		    return 1;
		}
	    }
	}
    }
    return 0;
}